

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_dispatch.h
# Opt level: O1

void __kmp_dispatch_deo<unsigned_int>(int *gtid_ref,int *cid_ref,ident_t *loc_ref)

{
  kmp_info_t *pkVar1;
  void *in_RCX;
  dispatch_private_info_t *unaff_RBX;
  
  pkVar1 = __kmp_threads[*gtid_ref];
  if ((__kmp_env_consistency_check != 0) &&
     (unaff_RBX = ((pkVar1->th).th_dispatch)->th_dispatch_pr_current,
     unaff_RBX->pushed_ws != ct_none)) {
    in_RCX = (void *)0x0;
    __kmp_push_sync(*gtid_ref,ct_ordered_in_pdo,loc_ref,(kmp_user_lock_p)0x0,0);
  }
  if ((((pkVar1->th).th_team)->t).t_serialized != 0) {
    return;
  }
  if (__kmp_env_consistency_check == 0) {
    unaff_RBX = ((pkVar1->th).th_dispatch)->th_dispatch_pr_current;
  }
  __kmp_wait<unsigned_int>
            (&(((pkVar1->th).th_dispatch)->th_dispatch_sh_current->u).s32.ordered_iteration,
             (unaff_RBX->u).p32.ordered_lower,__kmp_ge<unsigned_int>,in_RCX);
  return;
}

Assistant:

void __kmp_dispatch_deo(int *gtid_ref, int *cid_ref, ident_t *loc_ref) {
  dispatch_private_info_template<UT> *pr;

  int gtid = *gtid_ref;
  //    int  cid = *cid_ref;
  kmp_info_t *th = __kmp_threads[gtid];
  KMP_DEBUG_ASSERT(th->th.th_dispatch);

  KD_TRACE(100, ("__kmp_dispatch_deo: T#%d called\n", gtid));
  if (__kmp_env_consistency_check) {
    pr = reinterpret_cast<dispatch_private_info_template<UT> *>(
        th->th.th_dispatch->th_dispatch_pr_current);
    if (pr->pushed_ws != ct_none) {
#if KMP_USE_DYNAMIC_LOCK
      __kmp_push_sync(gtid, ct_ordered_in_pdo, loc_ref, NULL, 0);
#else
      __kmp_push_sync(gtid, ct_ordered_in_pdo, loc_ref, NULL);
#endif
    }
  }

  if (!th->th.th_team->t.t_serialized) {
    dispatch_shared_info_template<UT> *sh =
        reinterpret_cast<dispatch_shared_info_template<UT> *>(
            th->th.th_dispatch->th_dispatch_sh_current);
    UT lower;

    if (!__kmp_env_consistency_check) {
      pr = reinterpret_cast<dispatch_private_info_template<UT> *>(
          th->th.th_dispatch->th_dispatch_pr_current);
    }
    lower = pr->u.p.ordered_lower;

#if !defined(KMP_GOMP_COMPAT)
    if (__kmp_env_consistency_check) {
      if (pr->ordered_bumped) {
        struct cons_header *p = __kmp_threads[gtid]->th.th_cons;
        __kmp_error_construct2(kmp_i18n_msg_CnsMultipleNesting,
                               ct_ordered_in_pdo, loc_ref,
                               &p->stack_data[p->w_top]);
      }
    }
#endif /* !defined(KMP_GOMP_COMPAT) */

    KMP_MB();
#ifdef KMP_DEBUG
    {
      char *buff;
      // create format specifiers before the debug output
      buff = __kmp_str_format("__kmp_dispatch_deo: T#%%d before wait: "
                              "ordered_iter:%%%s lower:%%%s\n",
                              traits_t<UT>::spec, traits_t<UT>::spec);
      KD_TRACE(1000, (buff, gtid, sh->u.s.ordered_iteration, lower));
      __kmp_str_free(&buff);
    }
#endif
    __kmp_wait<UT>(&sh->u.s.ordered_iteration, lower,
                   __kmp_ge<UT> USE_ITT_BUILD_ARG(NULL));
    KMP_MB(); /* is this necessary? */
#ifdef KMP_DEBUG
    {
      char *buff;
      // create format specifiers before the debug output
      buff = __kmp_str_format("__kmp_dispatch_deo: T#%%d after wait: "
                              "ordered_iter:%%%s lower:%%%s\n",
                              traits_t<UT>::spec, traits_t<UT>::spec);
      KD_TRACE(1000, (buff, gtid, sh->u.s.ordered_iteration, lower));
      __kmp_str_free(&buff);
    }
#endif
  }
  KD_TRACE(100, ("__kmp_dispatch_deo: T#%d returned\n", gtid));
}